

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

TriggerPrg * getRowTrigger(Parse *pParse,Trigger *pTrigger,Table *pTab,int orconf)

{
  u8 uVar1;
  sqlite3 *db;
  Op *pOVar2;
  undefined8 db_00;
  byte bVar3;
  int iVar4;
  Parse *pPVar5;
  TriggerPrg *pTVar6;
  SubProgram *pSVar7;
  Vdbe *pVVar8;
  char *pcVar9;
  Expr *pEVar10;
  SrcList *pSVar11;
  IdList *pColumn;
  Upsert *pUpsert;
  Select *pSVar12;
  ExprList *pEVar13;
  int dest;
  Expr *in_R8;
  TriggerStep *pStep;
  long in_FS_OFFSET;
  Expr *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined1 local_240 [24];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  undefined8 uStack_200;
  int local_1f8;
  undefined4 uStack_1f4;
  char *pcStack_1f0;
  ExprList *local_1e8;
  undefined1 local_1e0 [240];
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  Parse *local_d8;
  char *pcStack_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [88];
  char *local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  for (pTVar6 = pPVar5->pTriggerPrg; pTVar6 != (TriggerPrg *)0x0; pTVar6 = pTVar6->pNext) {
    if ((pTVar6->pTrigger == pTrigger) && (pTVar6->orconf == orconf)) goto LAB_001a6101;
  }
  db = pParse->db;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1e0._232_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  pTVar6 = (TriggerPrg *)sqlite3DbMallocZero(db,0x28);
  if (pTVar6 != (TriggerPrg *)0x0) {
    pTVar6->pNext = pPVar5->pTriggerPrg;
    pPVar5->pTriggerPrg = pTVar6;
    pSVar7 = (SubProgram *)sqlite3DbMallocZero(db,0x30);
    pTVar6->pProgram = pSVar7;
    if (pSVar7 != (SubProgram *)0x0) {
      pVVar8 = pPVar5->pVdbe;
      pSVar7->pNext = pVVar8->pProgram;
      pVVar8->pProgram = pSVar7;
      pTVar6->pTrigger = pTrigger;
      pTVar6->orconf = orconf;
      pTVar6->aColmask[0] = 0xffffffff;
      pTVar6->aColmask[1] = 0xffffffff;
      memset(local_1e0 + 8,0,0xe0);
      memset(local_c0,0,0x88);
      local_d8 = db->pParse;
      local_240._0_8_ = local_1e0;
      db->pParse = (Parse *)local_240._0_8_;
      local_1e0._0_8_ = db;
      if (db->mallocFailed != '\0') {
        sqlite3ErrorMsg((Parse *)local_1e0,"out of memory");
      }
      local_218 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      local_240._8_16_ = (undefined1  [16])0x0;
      local_68 = pTrigger->zName;
      local_1e0[0xe2] = pTrigger->op;
      local_1e0._224_2_ = pParse->nQueryLoop;
      local_1e0[0x25] = pParse->prepFlags;
      local_1e0._176_8_ = pPVar5;
      local_1e0._184_8_ = pTab;
      pVVar8 = sqlite3GetVdbe((Parse *)local_240._0_8_);
      if (pVVar8 == (Vdbe *)0x0) {
        if (pParse->nErr == 0) {
          pParse->zErrMsg = (char *)local_1e0._8_8_;
          pParse->nErr = local_1e0._52_4_;
          pParse->rc = local_1e0._24_4_;
        }
        else if ((char *)local_1e0._8_8_ != (char *)0x0) {
          sqlite3DbFreeNN((sqlite3 *)local_1e0._0_8_,(void *)local_1e0._8_8_);
        }
      }
      else {
        if (pTrigger->zName != (char *)0x0) {
          pcVar9 = sqlite3MPrintf(db,"-- TRIGGER %s");
          sqlite3VdbeChangeP4(pVVar8,-1,pcVar9,-6);
        }
        if (pTrigger->pWhen == (Expr *)0x0) {
          dest = 0;
        }
        else {
          dest = 0;
          pEVar10 = exprDup(db,pTrigger->pWhen,0,(EdupBuf *)0x0);
          if (db->mallocFailed == '\0') {
            iVar4 = sqlite3ResolveExprNames((NameContext *)local_240,pEVar10);
            if (iVar4 == 0) {
              dest = local_1e0._72_4_ + -1;
              local_1e0._72_4_ = dest;
              sqlite3ExprIfFalse((Parse *)local_1e0,pEVar10,dest,0x10);
            }
          }
          if (pEVar10 != (Expr *)0x0) {
            sqlite3ExprDeleteNN(db,pEVar10);
          }
        }
        db_00 = local_1e0._0_8_;
        pStep = pTrigger->step_list;
        if (pStep != (TriggerStep *)0x0) {
          do {
            pEVar13 = (ExprList *)(ulong)(uint)orconf;
            local_1e0[0xe4] = (byte)orconf;
            if (orconf == 0xb) {
              local_1e0[0xe4] = pStep->orconf;
            }
            if (pStep->zSpan != (char *)0x0) {
              pcVar9 = sqlite3MPrintf((sqlite3 *)db_00,"-- %s");
              in_R8 = (Expr *)0x0;
              iVar4 = sqlite3VdbeAddOp3((Vdbe *)local_1e0._16_8_,0xb8,0x7fffffff,1,0);
              pEVar13 = (ExprList *)0xfffffffa;
              sqlite3VdbeChangeP4((Vdbe *)local_1e0._16_8_,iVar4,pcVar9,-6);
            }
            uVar1 = pStep->op;
            if (uVar1 == 0x80) {
              pSVar11 = sqlite3TriggerStepSrc((Parse *)local_1e0,pStep);
              pSVar12 = sqlite3SelectDup((sqlite3 *)db_00,pStep->pSelect,0);
              pColumn = sqlite3IdListDup((sqlite3 *)db_00,pStep->pIdList);
              bVar3 = local_1e0[0xe4];
              pUpsert = sqlite3UpsertDup((sqlite3 *)db_00,pStep->pUpsert);
              sqlite3Insert((Parse *)local_1e0,pSVar11,pSVar12,pColumn,(uint)bVar3,pUpsert);
LAB_001a5fde:
              in_R8 = (Expr *)0x0;
              sqlite3VdbeAddOp3((Vdbe *)local_1e0._16_8_,0x83,0,0,0);
            }
            else {
              if (uVar1 == 0x81) {
                pSVar11 = sqlite3TriggerStepSrc((Parse *)local_1e0,pStep);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar10 = (Expr *)0x0;
                }
                else {
                  pEVar13 = (ExprList *)0x0;
                  pEVar10 = exprDup((sqlite3 *)db_00,pStep->pWhere,0,(EdupBuf *)0x0);
                }
                sqlite3DeleteFrom((Parse *)local_1e0,pSVar11,pEVar10,pEVar13,in_R8);
                goto LAB_001a5fde;
              }
              if (uVar1 == 0x82) {
                pSVar11 = sqlite3TriggerStepSrc((Parse *)local_1e0,pStep);
                pEVar13 = sqlite3ExprListDup((sqlite3 *)db_00,pStep->pExprList,0);
                if (pStep->pWhere == (Expr *)0x0) {
                  pEVar10 = (Expr *)0x0;
                }
                else {
                  pEVar10 = exprDup((sqlite3 *)db_00,pStep->pWhere,0,(EdupBuf *)0x0);
                }
                sqlite3Update((Parse *)local_1e0,pSVar11,pEVar13,pEVar10,(uint)local_1e0[0xe4],
                              (ExprList *)0x0,in_stack_fffffffffffffd68,
                              (Upsert *)CONCAT44(orconf,in_stack_fffffffffffffd70));
                goto LAB_001a5fde;
              }
              local_1e8 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
              local_1f8 = -0x55555556;
              uStack_1f4 = 0xaaaaaaaa;
              pcStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
              local_208._0_4_ = 0xaaaaaaaa;
              local_208._4_4_ = -0x55555556;
              uStack_200 = &DAT_aaaaaaaaaaaaaaaa;
              pSVar12 = sqlite3SelectDup((sqlite3 *)db_00,pStep->pSelect,0);
              local_208[0] = '\x04';
              pcStack_1f0 = (char *)0x0;
              local_208._4_4_ = 0;
              uStack_200._0_4_ = 0;
              uStack_200._4_4_ = 0;
              local_1f8 = 0;
              sqlite3Select((Parse *)local_1e0,pSVar12,(SelectDest *)local_208);
              if (pSVar12 != (Select *)0x0) {
                clearSelect((sqlite3 *)db_00,pSVar12,1);
              }
            }
            pStep = pStep->pNext;
          } while (pStep != (TriggerStep *)0x0);
        }
        if (dest != 0) {
          sqlite3VdbeResolveLabel(pVVar8,dest);
        }
        sqlite3VdbeAddOp3(pVVar8,0x46,0,0,0);
        if (pParse->nErr == 0) {
          pParse->zErrMsg = (char *)local_1e0._8_8_;
          pParse->nErr = local_1e0._52_4_;
          pParse->rc = local_1e0._24_4_;
LAB_001a6074:
          if (local_1e0._52_4_ == 0) {
            pOVar2 = pVVar8->aOp;
            resolveP2Values(pVVar8,&pPVar5->nMaxArg);
            pSVar7->nOp = pVVar8->nOp;
            pVVar8->aOp = (Op *)0x0;
            pSVar7->aOp = pOVar2;
          }
        }
        else if ((char *)local_1e0._8_8_ != (char *)0x0) {
          sqlite3DbFreeNN((sqlite3 *)local_1e0._0_8_,(void *)local_1e0._8_8_);
          local_1e0._52_4_ = pParse->nErr;
          goto LAB_001a6074;
        }
        pSVar7->nMem = SUB84(local_1e0._56_8_,4);
        pSVar7->nCsr = (int)local_1e0._56_8_;
        pSVar7->token = pTrigger;
        pTVar6->aColmask[0] = local_1e0._216_4_;
        pTVar6->aColmask[1] = local_1e0._220_4_;
        sqlite3VdbeDelete(pVVar8);
      }
      sqlite3ParseObjectReset((Parse *)local_1e0);
      goto LAB_001a60f7;
    }
  }
  pTVar6 = (TriggerPrg *)0x0;
LAB_001a60f7:
  pParse->db->errByteOffset = -1;
LAB_001a6101:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pTVar6;
  }
  __stack_chk_fail();
}

Assistant:

static TriggerPrg *getRowTrigger(
  Parse *pParse,       /* Current parse context */
  Trigger *pTrigger,   /* Trigger to code */
  Table *pTab,         /* The table trigger pTrigger is attached to */
  int orconf           /* ON CONFLICT algorithm. */
){
  Parse *pRoot = sqlite3ParseToplevel(pParse);
  TriggerPrg *pPrg;

  assert( pTrigger->zName==0 || pTab==tableOfTrigger(pTrigger) );

  /* It may be that this trigger has already been coded (or is in the
  ** process of being coded). If this is the case, then an entry with
  ** a matching TriggerPrg.pTrigger field will be present somewhere
  ** in the Parse.pTriggerPrg list. Search for such an entry.  */
  for(pPrg=pRoot->pTriggerPrg;
      pPrg && (pPrg->pTrigger!=pTrigger || pPrg->orconf!=orconf);
      pPrg=pPrg->pNext
  );

  /* If an existing TriggerPrg could not be located, create a new one. */
  if( !pPrg ){
    pPrg = codeRowTrigger(pParse, pTrigger, pTab, orconf);
    pParse->db->errByteOffset = -1;
  }

  return pPrg;
}